

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::PrimReserve(ImDrawList *this,int idx_count,int vtx_count)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  ImDrawCmd *pIVar4;
  ImDrawVert *__src;
  unsigned_short *__src_00;
  ImDrawVert *__dest;
  unsigned_short *__dest_00;
  long lVar5;
  int iVar6;
  int iVar7;
  
  if ((0xffff < this->_VtxCurrentIdx + vtx_count) && ((this->Flags & 8) != 0)) {
    uVar2 = (this->VtxBuffer).Size;
    (this->_CmdHeader).VtxOffset = uVar2;
    this->_VtxCurrentIdx = 0;
    pIVar4 = (this->CmdBuffer).Data;
    lVar5 = (long)(this->CmdBuffer).Size;
    if (pIVar4[lVar5 + -1].ElemCount == 0) {
      pIVar4[lVar5 + -1].VtxOffset = uVar2;
    }
    else {
      AddDrawCmd(this);
    }
  }
  puVar1 = &(this->CmdBuffer).Data[(long)(this->CmdBuffer).Size + -1].ElemCount;
  *puVar1 = *puVar1 + idx_count;
  iVar3 = (this->VtxBuffer).Size;
  iVar7 = vtx_count + iVar3;
  iVar6 = (this->VtxBuffer).Capacity;
  if (iVar6 < iVar7) {
    if (iVar6 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar6 / 2 + iVar6;
    }
    if (iVar6 <= iVar7) {
      iVar6 = iVar7;
    }
    __dest = (ImDrawVert *)ImGui::MemAlloc((long)iVar6 * 0x14);
    __src = (this->VtxBuffer).Data;
    if (__src != (ImDrawVert *)0x0) {
      memcpy(__dest,__src,(long)(this->VtxBuffer).Size * 0x14);
      ImGui::MemFree((this->VtxBuffer).Data);
    }
    (this->VtxBuffer).Data = __dest;
    (this->VtxBuffer).Capacity = iVar6;
  }
  else {
    __dest = (this->VtxBuffer).Data;
  }
  (this->VtxBuffer).Size = iVar7;
  this->_VtxWritePtr = __dest + iVar3;
  iVar3 = (this->IdxBuffer).Size;
  iVar7 = idx_count + iVar3;
  iVar6 = (this->IdxBuffer).Capacity;
  if (iVar6 < iVar7) {
    if (iVar6 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar6 / 2 + iVar6;
    }
    if (iVar6 <= iVar7) {
      iVar6 = iVar7;
    }
    __dest_00 = (unsigned_short *)ImGui::MemAlloc((long)iVar6 * 2);
    __src_00 = (this->IdxBuffer).Data;
    if (__src_00 != (unsigned_short *)0x0) {
      memcpy(__dest_00,__src_00,(long)(this->IdxBuffer).Size * 2);
      ImGui::MemFree((this->IdxBuffer).Data);
    }
    (this->IdxBuffer).Data = __dest_00;
    (this->IdxBuffer).Capacity = iVar6;
  }
  else {
    __dest_00 = (this->IdxBuffer).Data;
  }
  (this->IdxBuffer).Size = iVar7;
  this->_IdxWritePtr = __dest_00 + iVar3;
  return;
}

Assistant:

void ImDrawList::PrimReserve(int idx_count, int vtx_count)
{
    // Large mesh support (when enabled)
    IM_ASSERT_PARANOID(idx_count >= 0 && vtx_count >= 0);
    if (sizeof(ImDrawIdx) == 2 && (_VtxCurrentIdx + vtx_count >= (1 << 16)) && (Flags & ImDrawListFlags_AllowVtxOffset))
    {
        // FIXME: In theory we should be testing that vtx_count <64k here.
        // In practice, RenderText() relies on reserving ahead for a worst case scenario so it is currently useful for us
        // to not make that check until we rework the text functions to handle clipping and large horizontal lines better.
        _CmdHeader.VtxOffset = VtxBuffer.Size;
        _OnChangedVtxOffset();
    }

    ImDrawCmd* draw_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    draw_cmd->ElemCount += idx_count;

    int vtx_buffer_old_size = VtxBuffer.Size;
    VtxBuffer.resize(vtx_buffer_old_size + vtx_count);
    _VtxWritePtr = VtxBuffer.Data + vtx_buffer_old_size;

    int idx_buffer_old_size = IdxBuffer.Size;
    IdxBuffer.resize(idx_buffer_old_size + idx_count);
    _IdxWritePtr = IdxBuffer.Data + idx_buffer_old_size;
}